

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O2

void makeIntColumns(Matrix<Rational> *m)

{
  uint uVar1;
  Rational *pRVar2;
  bool bVar3;
  uint i;
  uint uVar4;
  ulong uVar5;
  uint local_128;
  uint local_124;
  BigInteger g;
  BigInteger local_f0;
  BigInteger local_d0;
  Rational local_b0;
  BigInteger local_70;
  BigInteger local_50;
  
  for (uVar5 = 0; uVar5 < m->N; uVar5 = uVar5 + 1) {
    BigInteger::BigInteger(&g,1);
    local_124 = 0;
    local_128 = 0;
    for (uVar4 = 0; uVar4 < m->M; uVar4 = uVar4 + 1) {
      BigInteger::BigInteger(&local_b0._numerator,&m->arr[m->N * uVar4 + uVar5]._denominator);
      BigInteger::BigInteger(&local_d0,1);
      bVar3 = operator!=(&local_b0._numerator,&local_d0);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_d0);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_b0);
      if (bVar3) {
        BigInteger::BigInteger(&local_b0._numerator,&m->arr[m->N * uVar4 + uVar5]._denominator);
        BigInteger::BigInteger(&local_f0,&g);
        BigInteger::BigInteger(&local_70,&m->arr[m->N * uVar4 + uVar5]._denominator);
        gcd(&local_d0,&local_f0,&local_70);
        operator/(&local_50,&local_b0._numerator,&local_d0);
        BigInteger::operator*=(&g,&local_50);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_50);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_d0);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_70);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_f0);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_b0);
      }
      uVar1 = m->N;
      pRVar2 = m->arr;
      Rational::Rational(&local_b0,0);
      bVar3 = operator>(pRVar2 + uVar1 * uVar4 + uVar5,&local_b0);
      Rational::~Rational(&local_b0);
      uVar1 = m->N;
      pRVar2 = m->arr;
      local_124 = local_124 + bVar3;
      Rational::Rational(&local_b0,0);
      bVar3 = operator<(pRVar2 + uVar1 * uVar4 + uVar5,&local_b0);
      local_128 = local_128 + bVar3;
      Rational::~Rational(&local_b0);
    }
    if (local_124 < local_128) {
      BigInteger::operator-(&local_b0._numerator,&g);
      BigInteger::operator=(&g,&local_b0._numerator);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_b0);
    }
    for (uVar4 = 0; uVar4 < m->M; uVar4 = uVar4 + 1) {
      Rational::Rational(&local_b0,&g);
      Rational::operator*=(m->arr + m->N * uVar4 + uVar5,&local_b0);
      Rational::~Rational(&local_b0);
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&g);
  }
  return;
}

Assistant:

void makeIntColumns(Matrix<Rational> &m)
{
    for(unsigned col = 0; col < m.width(); ++col)
    {
        BigInteger g = 1;
        unsigned pos = 0, neg = 0;
        for(unsigned i = 0; i < m.height(); ++i)
        {
            if(m[i][col].denominator() != 1)
                g *= m[i][col].denominator() / gcd(g, m[i][col].denominator());
            pos += m[i][col] > 0;
            neg += m[i][col] < 0;
        }
        if(neg > pos)
            g = -g;
        for(unsigned i = 0; i < m.height(); ++i)
        {
            m[i][col] *= g;
        }
    }
}